

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

void parse_blend_axis_types(T1_Face face,T1_Loader loader)

{
  PS_Blend pPVar1;
  FT_Memory memory_00;
  uint uVar2;
  long *plVar3;
  FT_String *pFVar4;
  FT_UInt len;
  FT_Byte *name;
  T1_Token token;
  FT_Memory memory;
  PS_Blend blend;
  FT_UInt local_80;
  FT_Error error;
  FT_Int num_axis;
  FT_Int n;
  T1_TokenRec axis_tokens [4];
  T1_Loader loader_local;
  T1_Face face_local;
  
  blend._4_4_ = 0;
  axis_tokens[3]._16_8_ = loader;
  (*(loader->parser).root.funcs.to_token_array)
            ((PS_Parser)loader,(T1_Token)&num_axis,4,(FT_Int *)&local_80);
  if ((int)local_80 < 0) {
    blend._4_4_ = 0xa2;
  }
  else if ((local_80 == 0) || (4 < (int)local_80)) {
    blend._4_4_ = 3;
  }
  else {
    blend._4_4_ = t1_allocate_blend(face,0,local_80);
    if (blend._4_4_ == 0) {
      pPVar1 = face->blend;
      memory_00 = (face->root).memory;
      for (error = 0; error < (int)local_80; error = error + 1) {
        plVar3 = (long *)(&num_axis + (long)error * 6);
        if (*(char *)*plVar3 == '/') {
          *plVar3 = *plVar3 + 1;
        }
        uVar2 = (int)axis_tokens[error].start - (int)*plVar3;
        if (uVar2 == 0) {
          blend._4_4_ = 3;
          break;
        }
        if (pPVar1->axis_names[error] != (FT_String *)0x0) {
          ft_mem_free(memory_00,pPVar1->axis_names[error]);
        }
        pFVar4 = (FT_String *)
                 ft_mem_alloc(memory_00,(ulong)(uVar2 + 1),(FT_Error *)((long)&blend + 4));
        pPVar1->axis_names[error] = pFVar4;
        if (blend._4_4_ != 0) break;
        pFVar4 = pPVar1->axis_names[error];
        memcpy(pFVar4,(void *)*plVar3,(ulong)uVar2);
        pFVar4[uVar2] = '\0';
      }
    }
  }
  *(FT_Error *)(axis_tokens[3]._16_8_ + 0x18) = blend._4_4_;
  return;
}

Assistant:

static void
  parse_blend_axis_types( T1_Face    face,
                          T1_Loader  loader )
  {
    T1_TokenRec  axis_tokens[T1_MAX_MM_AXIS];
    FT_Int       n, num_axis;
    FT_Error     error = FT_Err_Ok;
    PS_Blend     blend;
    FT_Memory    memory;


    /* take an array of objects */
    T1_ToTokenArray( &loader->parser, axis_tokens,
                     T1_MAX_MM_AXIS, &num_axis );
    if ( num_axis < 0 )
    {
      error = FT_ERR( Ignore );
      goto Exit;
    }
    if ( num_axis == 0 || num_axis > T1_MAX_MM_AXIS )
    {
      FT_ERROR(( "parse_blend_axis_types: incorrect number of axes: %d\n",
                 num_axis ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /* allocate blend if necessary */
    error = t1_allocate_blend( face, 0, (FT_UInt)num_axis );
    if ( error )
      goto Exit;

    blend  = face->blend;
    memory = face->root.memory;

    /* each token is an immediate containing the name of the axis */
    for ( n = 0; n < num_axis; n++ )
    {
      T1_Token  token = axis_tokens + n;
      FT_Byte*  name;
      FT_UInt   len;


      /* skip first slash, if any */
      if ( token->start[0] == '/' )
        token->start++;

      len = (FT_UInt)( token->limit - token->start );
      if ( len == 0 )
      {
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      name = (FT_Byte*)blend->axis_names[n];
      if ( name )
      {
        FT_TRACE0(( "parse_blend_axis_types:"
                    " overwriting axis name `%s' with `%*.s'\n",
                    name, len, token->start ));
        FT_FREE( name );
      }

      if ( FT_ALLOC( blend->axis_names[n], len + 1 ) )
        goto Exit;

      name = (FT_Byte*)blend->axis_names[n];
      FT_MEM_COPY( name, token->start, len );
      name[len] = '\0';
    }

  Exit:
    loader->parser.root.error = error;
  }